

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

void TTD::NSSnapValues::AssertSnapEquiv
               (SnapPromiseCapabilityInfo *capabilityInfo1,
               SnapPromiseCapabilityInfo *capabilityInfo2,TTDCompareMap *compareMap)

{
  PathEntry local_40;
  
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue
            (compareMap,capabilityInfo1->CapabilityId,capabilityInfo2->CapabilityId);
  local_40.IndexOrPID = -1;
  local_40.OptName = L"promiseVar";
  AssertSnapEquivTTDVar_Helper
            (capabilityInfo1->PromiseVar,capabilityInfo2->PromiseVar,compareMap,Special,&local_40);
  local_40.IndexOrPID = -1;
  local_40.OptName = L"resolveObjId";
  AssertSnapEquivTTDVar_Helper
            (capabilityInfo1->ResolveVar,capabilityInfo2->ResolveVar,compareMap,Special,&local_40);
  local_40.IndexOrPID = -1;
  local_40.OptName = L"rejectObjId";
  AssertSnapEquivTTDVar_Helper
            (capabilityInfo1->RejectVar,capabilityInfo2->RejectVar,compareMap,Special,&local_40);
  return;
}

Assistant:

void AssertSnapEquiv(const SnapPromiseCapabilityInfo* capabilityInfo1, const SnapPromiseCapabilityInfo* capabilityInfo2, TTDCompareMap& compareMap)
        {
            compareMap.CheckConsistentAndAddPtrIdMapping_NoEnqueue(capabilityInfo1->CapabilityId, capabilityInfo2->CapabilityId);

            AssertSnapEquivTTDVar_Special(capabilityInfo1->PromiseVar, capabilityInfo2->PromiseVar, compareMap, _u("promiseVar"));
            AssertSnapEquivTTDVar_Special(capabilityInfo1->ResolveVar, capabilityInfo2->ResolveVar, compareMap, _u("resolveObjId"));
            AssertSnapEquivTTDVar_Special(capabilityInfo1->RejectVar, capabilityInfo2->RejectVar, compareMap, _u("rejectObjId"));
        }